

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uniset.cpp
# Opt level: O0

void __thiscall icu_63::UnicodeSet::_add(UnicodeSet *this,UnicodeString *s)

{
  UBool UVar1;
  UnicodeString *this_00;
  UnicodeString *local_50;
  UErrorCode local_40 [2];
  UErrorCode ec;
  undefined1 local_29;
  UnicodeString *local_28;
  UnicodeString *local_20;
  UnicodeString *t;
  UnicodeString *s_local;
  UnicodeSet *this_local;
  
  t = s;
  s_local = (UnicodeString *)this;
  UVar1 = isFrozen(this);
  if ((UVar1 == '\0') && (UVar1 = isBogus(this), UVar1 == '\0')) {
    this_00 = (UnicodeString *)UMemory::operator_new((UMemory *)0x40,(size_t)s);
    local_29 = 0;
    local_50 = (UnicodeString *)0x0;
    if (this_00 != (UnicodeString *)0x0) {
      local_29 = 1;
      local_28 = this_00;
      UnicodeString::UnicodeString(this_00,t);
      local_50 = this_00;
    }
    local_20 = local_50;
    if (local_50 == (UnicodeString *)0x0) {
      setToBogus(this);
    }
    else {
      local_40[0] = U_ZERO_ERROR;
      UVector::sortedInsert(this->strings,local_50,compareUnicodeString,local_40);
      UVar1 = ::U_FAILURE(local_40[0]);
      if ((UVar1 != '\0') && (setToBogus(this), local_20 != (UnicodeString *)0x0)) {
        (*(local_20->super_Replaceable).super_UObject._vptr_UObject[1])();
      }
    }
  }
  return;
}

Assistant:

void UnicodeSet::_add(const UnicodeString& s) {
    if (isFrozen() || isBogus()) {
        return;
    }
    UnicodeString* t = new UnicodeString(s);
    if (t == NULL) { // Check for memory allocation error.
        setToBogus();
        return;
    }
    UErrorCode ec = U_ZERO_ERROR;
    strings->sortedInsert(t, compareUnicodeString, ec);
    if (U_FAILURE(ec)) {
        setToBogus();
        delete t;
    }
}